

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::OpaqueAttribute::OpaqueAttribute(OpaqueAttribute *this,OpaqueAttribute *other)

{
  char *__dest;
  char *__src;
  long in_RSI;
  Array<char> *in_RDI;
  long in_stack_ffffffffffffffb8;
  Array<char> *in_stack_ffffffffffffffc0;
  Array<char> *size;
  
  Attribute::Attribute((Attribute *)in_RDI);
  in_RDI->_size = (long)&PTR__OpaqueAttribute_002acd48;
  std::__cxx11::string::string((string *)&in_RDI->_data,(string *)(in_RSI + 8));
  in_RDI[2]._data = *(char **)(in_RSI + 0x28);
  size = in_RDI + 3;
  Array<char>::Array(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Array<char>::resizeErase(in_RDI,(long)size);
  __dest = Array::operator_cast_to_char_((Array *)(in_RDI + 3));
  __src = Array::operator_cast_to_char_((Array *)(in_RSI + 0x30));
  memcpy(__dest,__src,*(size_t *)(in_RSI + 0x28));
  return;
}

Assistant:

OpaqueAttribute::OpaqueAttribute (const OpaqueAttribute& other)
    : _typeName (other._typeName)
    , _dataSize (other._dataSize)
    , _data (other._dataSize)
{
    _data.resizeErase (other._dataSize);
    memcpy ((char*) _data, (const char*) other._data, other._dataSize);
}